

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O3

void __thiscall
flatbuffers::cpp::CppGenerator::GenStructConstructor
          (CppGenerator *this,StructDef *struct_def,GenArrayArgMode array_mode)

{
  uint uVar1;
  Value *type;
  BaseType BVar2;
  BaseType BVar3;
  pointer ppFVar4;
  FieldDef *field;
  long lVar5;
  long *plVar6;
  mapped_type *pmVar7;
  ulong *puVar8;
  long *plVar9;
  size_type *psVar10;
  pointer pcVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  StructDef *pSVar13;
  undefined8 uVar14;
  _Alloc_hider _Var15;
  long lVar16;
  string scalar_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> arg_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> field_name;
  int padding_id;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> arg_name_1;
  string init_list;
  string arg_list;
  undefined1 local_270 [16];
  undefined1 local_260 [16];
  string local_250;
  string local_230;
  CodeWriter *local_210;
  CppGenerator *local_208;
  GenArrayArgMode local_200;
  int local_1fc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  StructDef *local_1d8;
  string local_1d0;
  string local_1b0;
  undefined1 *local_190;
  long local_188;
  undefined1 local_180;
  undefined7 uStack_17f;
  long *local_170;
  long local_168;
  long local_160;
  long lStack_158;
  long *local_150;
  long local_148;
  long local_140;
  long lStack_138;
  long *local_130;
  long local_128;
  long local_120;
  long lStack_118;
  string local_110;
  string local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_190 = &local_180;
  local_188 = 0;
  local_180 = 0;
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  local_1b0._M_string_length = 0;
  local_1b0.field_2._M_local_buf[0] = '\0';
  local_1fc = 0;
  ppFVar4 = (struct_def->fields).vec.
            super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  local_208 = this;
  local_200 = array_mode;
  local_1d8 = struct_def;
  if (ppFVar4 !=
      (struct_def->fields).vec.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    lVar16 = 0;
    do {
      field = *(FieldDef **)((long)ppFVar4 + lVar16);
      BVar2 = (field->value).type.base_type;
      Name_abi_cxx11_((string *)local_270,local_208,field);
      plVar6 = (long *)std::__cxx11::string::replace((ulong)local_270,0,(char *)0x0,0x3621c9);
      local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
      puVar8 = (ulong *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar8) {
        local_250.field_2._M_allocated_capacity = *puVar8;
        local_250.field_2._8_8_ = plVar6[3];
      }
      else {
        local_250.field_2._M_allocated_capacity = *puVar8;
        local_250._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_250._M_string_length = plVar6[1];
      *plVar6 = (long)puVar8;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      if ((undefined1 *)local_270._0_8_ != local_260) {
        operator_delete((void *)local_270._0_8_,(ulong)(local_260._0_8_ + 1));
      }
      type = &field->value;
      local_210 = (CodeWriter *)
                  CONCAT71(local_210._1_7_,
                           BVar2 != BASE_TYPE_ARRAY || local_200 != kArrayArgModeNone);
      if (BVar2 == BASE_TYPE_ARRAY && local_200 == kArrayArgModeNone) {
LAB_0017f06d:
        if ((lVar16 != 0) && (local_1b0._M_string_length != 0)) {
          std::__cxx11::string::append((char *)&local_1b0);
        }
        Name_abi_cxx11_(&local_230,local_208,field);
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_230);
        local_270._0_8_ = local_260;
        plVar9 = plVar6 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)plVar9) {
          local_260._0_8_ = *plVar9;
          local_260._8_8_ = plVar6[3];
        }
        else {
          local_260._0_8_ = *plVar9;
          local_270._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*plVar6;
        }
        local_270._8_8_ = plVar6[1];
        *plVar6 = (long)plVar9;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_1b0,local_270._0_8_);
        if ((undefined1 *)local_270._0_8_ != local_260) {
          operator_delete((void *)local_270._0_8_,(ulong)(local_260._0_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p != &local_230.field_2) {
          operator_delete(local_230._M_dataplus._M_p,
                          (ulong)(local_230.field_2._M_allocated_capacity + 1));
        }
        BVar3 = (type->type).base_type;
        if (BVar3 - BASE_TYPE_UTYPE < 0xc) {
          GenUnderlyingCast((string *)local_270,local_208,field,false,&local_250);
          std::operator+(&local_1f8,"(::flatbuffers::EndianScalar(",(string *)local_270);
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_1f8);
          local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
          plVar9 = plVar6 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)plVar9) {
            local_230.field_2._M_allocated_capacity = *plVar9;
            local_230.field_2._8_8_ = plVar6[3];
          }
          else {
            local_230.field_2._M_allocated_capacity = *plVar9;
            local_230._M_dataplus._M_p = (pointer)*plVar6;
          }
          local_230._M_string_length = plVar6[1];
          *plVar6 = (long)plVar9;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          std::__cxx11::string::_M_append((char *)&local_1b0,(ulong)local_230._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_230._M_dataplus._M_p != &local_230.field_2) {
            operator_delete(local_230._M_dataplus._M_p,
                            (ulong)(local_230.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
            operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
          }
          uVar14 = local_260._0_8_;
          _Var15._M_p = (pointer)local_270._0_8_;
          if ((undefined1 *)local_270._0_8_ != local_260) {
LAB_0017f292:
            operator_delete(_Var15._M_p,(ulong)(uVar14 + 1));
          }
        }
        else {
          if ((char)local_210 != '\0') {
            if ((BVar3 != BASE_TYPE_STRUCT) || (((field->value).type.struct_def)->fixed == false)) {
              __assert_fail("(is_array && !init_arrays) || IsStruct(type)",
                            "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_cpp.cpp"
                            ,0xf18,
                            "void flatbuffers::cpp::CppGenerator::GenStructConstructor(const StructDef &, GenArrayArgMode)"
                           );
            }
            if (BVar2 != BASE_TYPE_ARRAY) {
              std::operator+(&local_230,"(",&local_250);
              plVar6 = (long *)std::__cxx11::string::append((char *)&local_230);
              plVar9 = plVar6 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar6 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)plVar9) {
                local_260._0_8_ = *plVar9;
                local_260._8_8_ = plVar6[3];
                local_270._0_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_260;
              }
              else {
                local_260._0_8_ = *plVar9;
                local_270._0_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)*plVar6;
              }
              local_270._8_8_ = plVar6[1];
              *plVar6 = (long)plVar9;
              plVar6[1] = 0;
              *(undefined1 *)(plVar6 + 2) = 0;
              std::__cxx11::string::_M_append((char *)&local_1b0,local_270._0_8_);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_270._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_260) {
                operator_delete((void *)local_270._0_8_,(ulong)(local_260._0_8_ + 1));
              }
              uVar14 = local_230.field_2._M_allocated_capacity;
              _Var15._M_p = local_230._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_230._M_dataplus._M_p != &local_230.field_2) goto LAB_0017f292;
              goto LAB_0017f29a;
            }
          }
          std::__cxx11::string::append((char *)&local_1b0);
        }
      }
      else {
        if ((lVar16 != 0) && (local_188 != 0)) {
          std::__cxx11::string::append((char *)&local_190);
        }
        if (BVar2 == BASE_TYPE_ARRAY) {
          GenTypeSpan_abi_cxx11_
                    ((string *)local_270,local_208,&type->type,true,
                     (ulong)(field->value).type.fixed_length);
        }
        else {
          GenTypeGet_abi_cxx11_((string *)local_270,local_208,&type->type," ","const "," &",true);
        }
        std::__cxx11::string::_M_append((char *)&local_190,local_270._0_8_);
        if ((undefined1 *)local_270._0_8_ != local_260) {
          operator_delete((void *)local_270._0_8_,(ulong)(local_260._0_8_ + 1));
        }
        std::__cxx11::string::_M_append((char *)&local_190,(ulong)local_250._M_dataplus._M_p);
        if ((local_200 == kArrayArgModeNone) || (BVar2 != BASE_TYPE_ARRAY)) goto LAB_0017f06d;
      }
LAB_0017f29a:
      if (field->padding != 0) {
        local_270._8_8_ = 0;
        local_270._0_8_ = PaddingInitializer;
        local_260._8_8_ =
             std::
             _Function_handler<void_(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_int_*),_void_(*)(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_int_*)>
             ::_M_invoke;
        local_260._0_8_ =
             std::
             _Function_handler<void_(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_int_*),_void_(*)(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_int_*)>
             ::_M_manager;
        GenPadding(field,&local_1b0,&local_1fc,
                   (function<void_(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_int_*)>
                    *)local_270);
        if ((code *)local_260._0_8_ != (code *)0x0) {
          (*(code *)local_260._0_8_)
                    ((function<void_(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_int_*)>
                      *)local_270,
                     (function<void_(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_int_*)>
                      *)local_270,3);
        }
      }
      paVar12 = &local_250.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != paVar12) {
        operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
      }
      lVar5 = lVar16 + 8;
      lVar16 = lVar16 + 8;
    } while ((pointer)((long)ppFVar4 + lVar5) !=
             (local_1d8->fields).vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
    if (local_188 != 0) {
      local_250._M_dataplus._M_p = (pointer)paVar12;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"ARG_LIST","");
      local_210 = &local_208->code_;
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&local_210->value_map_,&local_250);
      std::__cxx11::string::_M_assign((string *)pmVar7);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != paVar12) {
        operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
      }
      local_250._M_dataplus._M_p = (pointer)paVar12;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"INIT_LIST","");
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&local_210->value_map_,&local_250);
      std::__cxx11::string::_M_assign((string *)pmVar7);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != paVar12) {
        operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
      }
      if (local_1b0._M_string_length == 0) {
        paVar12 = &local_70.field_2;
        local_70._M_dataplus._M_p = (pointer)paVar12;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_70,"  {{STRUCT_NAME}}({{ARG_LIST}}) {","");
        CodeWriter::operator+=(local_210,&local_70);
        _Var15._M_p = local_70._M_dataplus._M_p;
      }
      else {
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_90,"  {{STRUCT_NAME}}({{ARG_LIST}})","");
        CodeWriter::operator+=(local_210,&local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        paVar12 = &local_50.field_2;
        local_50._M_dataplus._M_p = (pointer)paVar12;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,"      : {{INIT_LIST}} {","");
        CodeWriter::operator+=(local_210,&local_50);
        _Var15._M_p = local_50._M_dataplus._M_p;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var15._M_p != paVar12) {
        operator_delete(_Var15._M_p,paVar12->_M_allocated_capacity + 1);
      }
      local_1fc = 0;
      pSVar13 = (StructDef *)
                (local_1d8->fields).vec.
                super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_1d8 = (StructDef *)
                  (local_1d8->fields).vec.
                  super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      if (pSVar13 != local_1d8) {
        do {
          pcVar11 = (pSVar13->super_Definition).name._M_dataplus._M_p;
          if ((local_200 != kArrayArgModeNone) && (*(int *)(pcVar11 + 200) == 0x11)) {
            lVar16 = *(long *)(pcVar11 + 0xd8);
            uVar1 = *(int *)(pcVar11 + 0xcc) - 1;
            if ((0xb < uVar1) &&
               ((*(int *)(pcVar11 + 0xcc) != 0xf ||
                (*(char *)(*(long *)(pcVar11 + 0xd0) + 0x110) != '\x01')))) {
              __assert_fail("(IsScalar(element_type.base_type) || IsStruct(element_type)) && \"invalid declaration\""
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_cpp.cpp"
                            ,0xf34,
                            "void flatbuffers::cpp::CppGenerator::GenStructConstructor(const StructDef &, GenArrayArgMode)"
                           );
            }
            GenTypeGet_abi_cxx11_
                      (&local_250,local_208,(Type *)(pcVar11 + 200)," ","","",
                       uVar1 < 10 && lVar16 != 0);
            if (uVar1 < 10 && lVar16 != 0) {
              std::operator+(&local_230,"CastToArrayOfEnum<",&local_250);
              plVar6 = (long *)std::__cxx11::string::append((char *)&local_230);
              local_270._0_8_ = local_260;
              plVar9 = plVar6 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar6 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)plVar9) {
                local_260._0_8_ = *plVar9;
                local_260._8_8_ = plVar6[3];
              }
              else {
                local_260._0_8_ = *plVar9;
                local_270._0_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)*plVar6;
              }
              local_270._8_8_ = plVar6[1];
              *plVar6 = (long)plVar9;
              plVar6[1] = 0;
              *(undefined1 *)(plVar6 + 2) = 0;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_230._M_dataplus._M_p != &local_230.field_2) {
                operator_delete(local_230._M_dataplus._M_p,
                                (ulong)(local_230.field_2._M_allocated_capacity + 1));
              }
            }
            else {
              local_270._0_8_ = local_260;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"CastToArray","");
            }
            Name_abi_cxx11_(&local_1f8,local_208,
                            (FieldDef *)(pSVar13->super_Definition).name._M_dataplus._M_p);
            plVar6 = (long *)std::__cxx11::string::append((char *)&local_1f8);
            local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
            plVar9 = plVar6 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar6 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)plVar9) {
              local_230.field_2._M_allocated_capacity = *plVar9;
              local_230.field_2._8_8_ = plVar6[3];
            }
            else {
              local_230.field_2._M_allocated_capacity = *plVar9;
              local_230._M_dataplus._M_p = (pointer)*plVar6;
            }
            local_230._M_string_length = plVar6[1];
            *plVar6 = (long)plVar9;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
              operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1
                             );
            }
            Name_abi_cxx11_(&local_1d0,local_208,
                            (FieldDef *)(pSVar13->super_Definition).name._M_dataplus._M_p);
            plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_1d0,0,(char *)0x0,0x3621c9)
            ;
            local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
            psVar10 = (size_type *)(plVar6 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar6 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar10) {
              local_1f8.field_2._M_allocated_capacity = *psVar10;
              local_1f8.field_2._8_8_ = plVar6[3];
            }
            else {
              local_1f8.field_2._M_allocated_capacity = *psVar10;
              local_1f8._M_dataplus._M_p = (pointer)*plVar6;
            }
            local_1f8._M_string_length = plVar6[1];
            *plVar6 = (long)psVar10;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
              operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1
                             );
            }
            std::operator+(&local_b0,"    ::flatbuffers::",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_270);
            plVar6 = (long *)std::__cxx11::string::append((char *)&local_b0);
            local_170 = &local_160;
            plVar9 = plVar6 + 2;
            if ((long *)*plVar6 == plVar9) {
              local_160 = *plVar9;
              lStack_158 = plVar6[3];
            }
            else {
              local_160 = *plVar9;
              local_170 = (long *)*plVar6;
            }
            local_168 = plVar6[1];
            *plVar6 = (long)plVar9;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            plVar6 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_170,(ulong)local_230._M_dataplus._M_p);
            local_150 = &local_140;
            plVar9 = plVar6 + 2;
            if ((long *)*plVar6 == plVar9) {
              local_140 = *plVar9;
              lStack_138 = plVar6[3];
            }
            else {
              local_140 = *plVar9;
              local_150 = (long *)*plVar6;
            }
            local_148 = plVar6[1];
            *plVar6 = (long)plVar9;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            plVar6 = (long *)std::__cxx11::string::append((char *)&local_150);
            local_130 = &local_120;
            plVar9 = plVar6 + 2;
            if ((long *)*plVar6 == plVar9) {
              local_120 = *plVar9;
              lStack_118 = plVar6[3];
            }
            else {
              local_120 = *plVar9;
              local_130 = (long *)*plVar6;
            }
            local_128 = plVar6[1];
            *plVar6 = (long)plVar9;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            plVar6 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_130,(ulong)local_1f8._M_dataplus._M_p);
            local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
            psVar10 = (size_type *)(plVar6 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar6 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar10) {
              local_1d0.field_2._M_allocated_capacity = *psVar10;
              local_1d0.field_2._8_8_ = plVar6[3];
            }
            else {
              local_1d0.field_2._M_allocated_capacity = *psVar10;
              local_1d0._M_dataplus._M_p = (pointer)*plVar6;
            }
            local_1d0._M_string_length = plVar6[1];
            *plVar6 = (long)psVar10;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            plVar6 = (long *)std::__cxx11::string::append((char *)&local_1d0);
            psVar10 = (size_type *)(plVar6 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar6 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar10) {
              local_110.field_2._M_allocated_capacity = *psVar10;
              local_110.field_2._8_8_ = plVar6[3];
              local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
            }
            else {
              local_110.field_2._M_allocated_capacity = *psVar10;
              local_110._M_dataplus._M_p = (pointer)*plVar6;
            }
            local_110._M_string_length = plVar6[1];
            *plVar6 = (long)psVar10;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            CodeWriter::operator+=(local_210,&local_110);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_110._M_dataplus._M_p != &local_110.field_2) {
              operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
              operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_130 != &local_120) {
              operator_delete(local_130,local_120 + 1);
            }
            if (local_150 != &local_140) {
              operator_delete(local_150,local_140 + 1);
            }
            if (local_170 != &local_160) {
              operator_delete(local_170,local_160 + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
              operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
              operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230._M_dataplus._M_p != &local_230.field_2) {
              operator_delete(local_230._M_dataplus._M_p,
                              (ulong)(local_230.field_2._M_allocated_capacity + 1));
            }
            if ((undefined1 *)local_270._0_8_ != local_260) {
              operator_delete((void *)local_270._0_8_,(ulong)(local_260._0_8_ + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_250._M_dataplus._M_p != &local_250.field_2) {
              operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1
                             );
            }
            pcVar11 = (pSVar13->super_Definition).name._M_dataplus._M_p;
          }
          if (*(long *)(pcVar11 + 0x128) != 0) {
            local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
            local_250._M_string_length = 0;
            local_250.field_2._M_allocated_capacity =
                 local_250.field_2._M_allocated_capacity & 0xffffffffffffff00;
            local_270._8_8_ = 0;
            local_270._0_8_ = PaddingNoop;
            local_260._8_8_ =
                 std::
                 _Function_handler<void_(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_int_*),_void_(*)(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_int_*)>
                 ::_M_invoke;
            local_260._0_8_ =
                 std::
                 _Function_handler<void_(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_int_*),_void_(*)(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_int_*)>
                 ::_M_manager;
            GenPadding((FieldDef *)(pSVar13->super_Definition).name._M_dataplus._M_p,&local_250,
                       &local_1fc,
                       (function<void_(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_int_*)>
                        *)local_270);
            if ((code *)local_260._0_8_ != (code *)0x0) {
              (*(code *)local_260._0_8_)
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_270,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_270,3);
            }
            local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_f0,local_250._M_dataplus._M_p,
                       local_250._M_dataplus._M_p + local_250._M_string_length);
            CodeWriter::operator+=(local_210,&local_f0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
              operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_250._M_dataplus._M_p != &local_250.field_2) {
              operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1
                             );
            }
          }
          pSVar13 = (StructDef *)&(pSVar13->super_Definition).name._M_string_length;
        } while (pSVar13 != local_1d8);
      }
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"  }","");
      CodeWriter::operator+=(local_210,&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,
                    CONCAT71(local_1b0.field_2._M_allocated_capacity._1_7_,
                             local_1b0.field_2._M_local_buf[0]) + 1);
  }
  if (local_190 != &local_180) {
    operator_delete(local_190,CONCAT71(uStack_17f,local_180) + 1);
  }
  return;
}

Assistant:

void GenStructConstructor(const StructDef &struct_def,
                            GenArrayArgMode array_mode) {
    std::string arg_list;
    std::string init_list;
    int padding_id = 0;
    auto first = struct_def.fields.vec.begin();
    // skip arrays if generate ctor without array assignment
    const auto init_arrays = (array_mode != kArrayArgModeNone);
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      const auto &field = **it;
      const auto &type = field.value.type;
      const auto is_array = IsArray(type);
      const auto arg_name = "_" + Name(field);
      if (!is_array || init_arrays) {
        if (it != first && !arg_list.empty()) { arg_list += ", "; }
        arg_list += !is_array ? GenTypeGet(type, " ", "const ", " &", true)
                              : GenTypeSpan(type, true, type.fixed_length);
        arg_list += arg_name;
      }
      // skip an array with initialization from span
      if (false == (is_array && init_arrays)) {
        if (it != first && !init_list.empty()) { init_list += ",\n        "; }
        init_list += Name(field) + "_";
        if (IsScalar(type.base_type)) {
          auto scalar_type = GenUnderlyingCast(field, false, arg_name);
          init_list += "(::flatbuffers::EndianScalar(" + scalar_type + "))";
        } else {
          FLATBUFFERS_ASSERT((is_array && !init_arrays) || IsStruct(type));
          if (!is_array)
            init_list += "(" + arg_name + ")";
          else
            init_list += "()";
        }
      }
      if (field.padding)
        GenPadding(field, &init_list, &padding_id, PaddingInitializer);
    }

    if (!arg_list.empty()) {
      code_.SetValue("ARG_LIST", arg_list);
      code_.SetValue("INIT_LIST", init_list);
      if (!init_list.empty()) {
        code_ += "  {{STRUCT_NAME}}({{ARG_LIST}})";
        code_ += "      : {{INIT_LIST}} {";
      } else {
        code_ += "  {{STRUCT_NAME}}({{ARG_LIST}}) {";
      }
      padding_id = 0;
      for (const auto &field : struct_def.fields.vec) {
        const auto &type = field->value.type;
        if (IsArray(type) && init_arrays) {
          const auto &element_type = type.VectorType();
          const auto is_enum = IsEnum(element_type);
          FLATBUFFERS_ASSERT(
              (IsScalar(element_type.base_type) || IsStruct(element_type)) &&
              "invalid declaration");
          const auto face_type = GenTypeGet(type, " ", "", "", is_enum);
          std::string get_array =
              is_enum ? "CastToArrayOfEnum<" + face_type + ">" : "CastToArray";
          const auto field_name = Name(*field) + "_";
          const auto arg_name = "_" + Name(*field);
          code_ += "    ::flatbuffers::" + get_array + "(" + field_name +
                   ").CopyFromSpan(" + arg_name + ");";
        }
        if (field->padding) {
          std::string padding;
          GenPadding(*field, &padding, &padding_id, PaddingNoop);
          code_ += padding;
        }
      }
      code_ += "  }";
    }
  }